

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O0

char * c_escape(char *str,size_t len)

{
  byte bVar1;
  ushort **ppuVar2;
  byte *local_40;
  char *e;
  char *escaped;
  byte *pbStack_28;
  uchar c;
  char *s;
  size_t len_local;
  char *str_local;
  
  s = (char *)len;
  if (len == 0xffffffffffffffff) {
    s = (char *)strlen(str);
  }
  if (s < (char *)0x4000000000000000) {
    str_local = (char *)malloc((long)s * 4 + 1);
    local_40 = (byte *)str_local;
    pbStack_28 = (byte *)str;
    if ((byte *)str_local == (byte *)0x0) {
      str_local = (char *)0x0;
    }
    else {
      for (; bVar1 = *pbStack_28, bVar1 != 0; pbStack_28 = pbStack_28 + 1) {
        if (bVar1 == 10) {
          strcpy((char *)local_40,"\\n");
          local_40 = local_40 + 2;
        }
        else if (bVar1 == 0xd) {
          strcpy((char *)local_40,"\\r");
          local_40 = local_40 + 2;
        }
        else if (bVar1 == 9) {
          strcpy((char *)local_40,"\\t");
          local_40 = local_40 + 2;
        }
        else if (bVar1 == 0x5c) {
          strcpy((char *)local_40,"\\\\");
          local_40 = local_40 + 2;
        }
        else if (bVar1 == 0x22) {
          strcpy((char *)local_40,"\\\"");
          local_40 = local_40 + 2;
        }
        else {
          ppuVar2 = __ctype_b_loc();
          if (((*ppuVar2)[(int)(uint)bVar1] & 0x4000) == 0) {
            curl_msnprintf(local_40,5,"\\%03o",bVar1);
            local_40 = local_40 + 4;
          }
          else {
            *local_40 = bVar1;
            local_40 = local_40 + 1;
          }
        }
      }
      *local_40 = 0;
    }
  }
  else {
    str_local = (char *)0x0;
  }
  return str_local;
}

Assistant:

static char *c_escape(const char *str, size_t len)
{
  const char *s;
  unsigned char c;
  char *escaped, *e;

  if(len == CURL_ZERO_TERMINATED)
    len = strlen(str);

  /* Check for possible overflow. */
  if(len > (~(size_t) 0) / 4)
    return NULL;

  /* Allocate space based on worst-case */
  escaped = malloc(4 * len + 1);
  if(!escaped)
    return NULL;

  e = escaped;
  for(s = str; (c = *s) != '\0'; s++) {
    if(c == '\n') {
      strcpy(e, "\\n");
      e += 2;
    }
    else if(c == '\r') {
      strcpy(e, "\\r");
      e += 2;
    }
    else if(c == '\t') {
      strcpy(e, "\\t");
      e += 2;
    }
    else if(c == '\\') {
      strcpy(e, "\\\\");
      e += 2;
    }
    else if(c == '"') {
      strcpy(e, "\\\"");
      e += 2;
    }
    else if(! isprint(c)) {
      snprintf(e, 5, "\\%03o", (unsigned)c);
      e += 4;
    }
    else
      *e++ = c;
  }
  *e = '\0';
  return escaped;
}